

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLSGetNumMassSolves(void *arkode_mem,long *nmsolves)

{
  int iVar1;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLSGetNumMassSolves",&local_10,&local_18);
  if (iVar1 == 0) {
    *nmsolves = local_18->nmsolves;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkLSGetNumMassSolves(void *arkode_mem, long int *nmsolves)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure; set output value and return */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSGetNumMassSolves",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  *nmsolves = arkls_mem->nmsolves;
  return(ARKLS_SUCCESS);
}